

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_67::BinaryReaderIR::OnElseExpr(BinaryReaderIR *this)

{
  Result RVar1;
  IfExpr *pIVar2;
  IfExceptExpr *pIVar3;
  Enum EVar4;
  Location local_58;
  LabelNode *local_38;
  LabelNode *label;
  Expr *expr;
  
  RVar1 = TopLabelExpr(this,&local_38,(Expr **)&label);
  EVar4 = Error;
  if (RVar1.enum_ != Error) {
    if (local_38->label_type == IfExcept) {
      pIVar3 = cast<wabt::IfExceptExpr,wabt::Expr>((Expr *)label);
      GetLocation(&local_58,this);
      (pIVar3->true_).end_loc.field_1.field_1.offset = (size_t)local_58.field_1.field_1.offset;
      *(undefined8 *)((long)&(pIVar3->true_).end_loc.field_1 + 8) = local_58.field_1._8_8_;
      (pIVar3->true_).end_loc.filename.data_ = local_58.filename.data_;
      (pIVar3->true_).end_loc.filename.size_ = local_58.filename.size_;
      local_38->exprs = &pIVar3->false_;
      local_38->label_type = IfExceptElse;
    }
    else {
      if (local_38->label_type != If) {
        PrintError(this,"else expression without matching if");
        return (Result)Error;
      }
      pIVar2 = cast<wabt::IfExpr,wabt::Expr>((Expr *)label);
      GetLocation(&local_58,this);
      (pIVar2->true_).end_loc.field_1.field_1.offset = (size_t)local_58.field_1.field_1.offset;
      *(undefined8 *)((long)&(pIVar2->true_).end_loc.field_1 + 8) = local_58.field_1._8_8_;
      (pIVar2->true_).end_loc.filename.data_ = local_58.filename.data_;
      (pIVar2->true_).end_loc.filename.size_ = local_58.filename.size_;
      local_38->exprs = &pIVar2->false_;
      local_38->label_type = Else;
    }
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderIR::OnElseExpr() {
  LabelNode* label;
  Expr* expr;
  CHECK_RESULT(TopLabelExpr(&label, &expr));

  if (label->label_type == LabelType::If) {
    auto* if_expr = cast<IfExpr>(expr);
    if_expr->true_.end_loc = GetLocation();
    label->exprs = &if_expr->false_;
    label->label_type = LabelType::Else;
  } else if (label->label_type == LabelType::IfExcept) {
    auto* if_except_expr = cast<IfExceptExpr>(expr);
    if_except_expr->true_.end_loc = GetLocation();
    label->exprs = &if_except_expr->false_;
    label->label_type = LabelType::IfExceptElse;
  } else {
    PrintError("else expression without matching if");
    return Result::Error;
  }

  return Result::Ok;
}